

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O3

bool __thiscall Core::keysCheck(Core *this)

{
  bool bVar1;
  Core *this_00;
  _Alloc_hider local_38;
  undefined8 local_28;
  
  this_00 = (Core *)&stack0xffffffffffffffc8;
  bVar1 = Parsing::Parser::loadKeys(&this->_p);
  if (!bVar1) {
    local_38._M_p = (pointer)&stack0xffffffffffffffd8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffc8,"Missing keyword_lists.txt in rsrc!","");
    error(this_00,(string *)&stack0xffffffffffffffc8,true);
    if (local_38._M_p != (pointer)&stack0xffffffffffffffd8) {
      operator_delete(local_38._M_p,local_28 + 1);
    }
  }
  return bVar1;
}

Assistant:

bool Core::keysCheck()
{
    if (!_p.loadKeys())
        return error("Missing keyword_lists.txt in rsrc!", true);
    return true;
}